

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yangdata.c
# Opt level: O0

void remove_iffeature_type(lys_type *type,ly_ctx *ctx)

{
  uint local_1c;
  uint i;
  ly_ctx *ctx_local;
  lys_type *type_local;
  
  if (type->base == LY_TYPE_ENUM) {
    for (local_1c = 0; local_1c < (type->info).bits.count; local_1c = local_1c + 1) {
      remove_iffeature(&(type->info).bits.bit[local_1c].iffeature,
                       &(type->info).bits.bit[local_1c].iffeature_size,ctx);
    }
  }
  else if (type->base == LY_TYPE_BITS) {
    for (local_1c = 0; local_1c < (type->info).bits.count; local_1c = local_1c + 1) {
      remove_iffeature(&(type->info).bits.bit[local_1c].iffeature,
                       &(type->info).bits.bit[local_1c].iffeature_size,ctx);
    }
  }
  return;
}

Assistant:

void remove_iffeature_type(struct lys_type *type, struct ly_ctx *ctx) {
    unsigned int i;

    if (type->base == LY_TYPE_ENUM) {
        for (i = 0; i < type->info.enums.count; ++i) {
            remove_iffeature(&type->info.enums.enm[i].iffeature, &type->info.enums.enm[i].iffeature_size, ctx);
        }
    } else if (type->base == LY_TYPE_BITS) {
        for (i = 0; i < type->info.bits.count; ++i) {
            remove_iffeature(&type->info.bits.bit[i].iffeature, &type->info.bits.bit[i].iffeature_size, ctx);
        }
    }
}